

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::ResolvesFeaturesForImpl(DescriptorPool *this,int extension_number)

{
  void *pvVar1;
  pointer ppFVar2;
  FeatureSetDefaults *pFVar3;
  Rep *pRVar4;
  pointer ppFVar5;
  long lVar6;
  undefined1 *puVar7;
  ulong uVar8;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *this_00;
  RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *pRVar9;
  pointer ppFVar10;
  bool bVar11;
  Metadata MVar12;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  FeatureSet features;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_a8;
  void **local_88;
  FeatureSet local_80;
  
  pFVar3 = GetFeatureSetDefaults(this);
  this_00 = &(pFVar3->field_0)._impl_.defaults_;
  pRVar9 = this_00;
  if ((undefined1  [40])((undefined1  [40])pFVar3->field_0 & (undefined1  [40])0x1) !=
      (undefined1  [40])0x0) {
    pRVar4 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar9 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
             pRVar4->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar4 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
                pRVar4->elements;
    }
  }
  local_88 = &(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ +
             *(int *)((long)&pFVar3->field_0 + 0x10);
  if (pRVar9 == (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault> *)
                local_88) {
    bVar11 = true;
  }
  else {
    do {
      pvVar1 = (pRVar9->super_RepeatedPtrFieldBase).tagged_rep_or_elem_;
      local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      puVar7 = *(undefined1 **)((long)pvVar1 + 0x20);
      if ((FeatureSet *)puVar7 == (FeatureSet *)0x0) {
        puVar7 = _FeatureSet_default_instance_;
      }
      FeatureSet::FeatureSet(&local_80,(Arena *)0x0,(FeatureSet *)puVar7);
      puVar7 = *(undefined1 **)((long)pvVar1 + 0x18);
      if ((MessageLite *)puVar7 == (MessageLite *)0x0) {
        puVar7 = _FeatureSet_default_instance_;
      }
      FeatureSet::MergeImpl((MessageLite *)&local_80,(MessageLite *)puVar7);
      MVar12 = FeatureSet::GetMetadata((FeatureSet *)_FeatureSet_default_instance_);
      Reflection::ListFields(MVar12.reflection,&local_80.super_Message,&local_a8);
      ppFVar2 = local_a8.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      uVar8 = (long)local_a8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_a8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      ppFVar5 = local_a8.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (long)uVar8 >> 5) {
        ppFVar5 = (pointer)((uVar8 & 0xffffffffffffffe0) +
                           (long)local_a8.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
        lVar6 = ((long)uVar8 >> 5) + 1;
        ppFVar10 = local_a8.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start + 2;
        do {
          if (ppFVar10[-2]->number_ == extension_number) {
            ppFVar10 = ppFVar10 + -2;
            goto LAB_001c8f80;
          }
          if (ppFVar10[-1]->number_ == extension_number) {
            ppFVar10 = ppFVar10 + -1;
            goto LAB_001c8f80;
          }
          if ((*ppFVar10)->number_ == extension_number) goto LAB_001c8f80;
          if (ppFVar10[1]->number_ == extension_number) {
            ppFVar10 = ppFVar10 + 1;
            goto LAB_001c8f80;
          }
          lVar6 = lVar6 + -1;
          ppFVar10 = ppFVar10 + 4;
        } while (1 < lVar6);
        uVar8 = (long)local_a8.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5;
      }
      lVar6 = (long)uVar8 >> 3;
      if (lVar6 == 1) {
LAB_001c8f61:
        ppFVar10 = ppFVar5;
        if ((*ppFVar5)->number_ != extension_number) {
          ppFVar10 = local_a8.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      else if (lVar6 == 2) {
LAB_001c8f55:
        ppFVar10 = ppFVar5;
        if ((*ppFVar5)->number_ != extension_number) {
          ppFVar5 = ppFVar5 + 1;
          goto LAB_001c8f61;
        }
      }
      else {
        ppFVar10 = local_a8.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        if ((lVar6 == 3) && (ppFVar10 = ppFVar5, (*ppFVar5)->number_ != extension_number)) {
          ppFVar5 = ppFVar5 + 1;
          goto LAB_001c8f55;
        }
      }
LAB_001c8f80:
      bVar11 = ppFVar10 !=
               local_a8.
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      FeatureSet::~FeatureSet(&local_80);
      if (local_a8.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_a8.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a8.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    } while ((ppFVar10 != ppFVar2) &&
            (pRVar9 = (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                       *)&(pRVar9->super_RepeatedPtrFieldBase).current_size_,
            pRVar9 != (RepeatedPtrField<google::protobuf::FeatureSetDefaults_FeatureSetEditionDefault>
                       *)local_88));
  }
  return bVar11;
}

Assistant:

bool DescriptorPool::ResolvesFeaturesForImpl(int extension_number) const {
  for (const auto& edition_default : GetFeatureSetDefaults().defaults()) {
    std::vector<const FieldDescriptor*> fields;
    auto features = edition_default.fixed_features();
    features.MergeFrom(edition_default.overridable_features());
    features.GetReflection()->ListFields(features, &fields);
    if (absl::c_find_if(fields, [&](const FieldDescriptor* field) {
          return field->number() == extension_number;
        }) == fields.end()) {
      return false;
    }
  }
  return true;
}